

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcSort.c
# Opt level: O2

Mvc_Cube_t *
Mvc_CoverSortMerge(Mvc_Cube_t *pList1,Mvc_Cube_t *pList2,Mvc_Cube_t *pMask,
                  _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc)

{
  int iVar1;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pMVar4;
  Mvc_Cube_t *pMVar5;
  Mvc_Cube_t *pList;
  Mvc_Cube_t *local_30;
  
  local_30 = (Mvc_Cube_t *)0x0;
  pMVar5 = (Mvc_Cube_t *)&local_30;
  while ((pList1 != (Mvc_Cube_t *)0x0 && (pList2 != (Mvc_Cube_t *)0x0))) {
    iVar1 = (*pCompareFunc)(pList1,pList2,pMask);
    if (iVar1 < 0) {
      pMVar2 = pList1->pNext;
      pMVar3 = pList2;
      pMVar4 = pList1;
    }
    else {
      pMVar2 = pList1;
      pMVar3 = pList2->pNext;
      pMVar4 = pList2;
    }
    pMVar5->pNext = pMVar4;
    pList2 = pMVar3;
    pList1 = pMVar2;
    pMVar5 = pMVar4;
  }
  if (pList1 != (Mvc_Cube_t *)0x0) {
    pList2 = pList1;
  }
  pMVar5->pNext = pList2;
  return local_30;
}

Assistant:

Mvc_Cube_t * Mvc_CoverSortMerge( Mvc_Cube_t * pList1, Mvc_Cube_t * pList2, Mvc_Cube_t * pMask, int (* pCompareFunc)(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *) )
{
    Mvc_Cube_t * pList = NULL, ** ppTail = &pList;
    Mvc_Cube_t * pCube;
    while ( pList1 && pList2 )
    {
        if ( pCompareFunc( pList1, pList2, pMask ) < 0 )
        {
            pCube = pList1;
            pList1 = Mvc_CubeReadNext(pList1);
        }
        else
        {
            pCube = pList2;
            pList2 = Mvc_CubeReadNext(pList2);
        }
        *ppTail = pCube;
        ppTail = Mvc_CubeReadNextP(pCube);
    }
    *ppTail = pList1? pList1: pList2;
    return pList;
}